

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O3

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
mocker::LoopInvariantCodeMotion::findLoopInvariantComputation
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,LoopInvariantCodeMotion *this,size_t header,UseDefChain *useDef)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Hash_node_base *p_Var1;
  element_type *peVar2;
  pointer psVar3;
  const_iterator cVar4;
  BasicBlock *pBVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  element_type *addr;
  size_t *psVar9;
  unsigned_long __tmp;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  size_t elseLabel;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mustPass;
  shared_ptr<mocker::ir::IRInst> def;
  value_type inst;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  shared_ptr<mocker::ir::Reg> reg;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  related;
  queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
  worklist;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  res;
  RegSet loopInvVars;
  _List_node_base *local_1e0;
  size_t *local_1d8;
  size_t *psStack_1d0;
  long local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  shared_ptr<mocker::ir::IRInst> local_1b8;
  shared_ptr<mocker::ir::IRInst> local_1a8;
  size_t local_198;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_190;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_178;
  size_t *local_170;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_168;
  long local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_150;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
  local_f8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_198 = header;
  local_168 = (_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)useDef;
  cVar4 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&this->loopTree,&local_198);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  LoopInfo::getLoopInvariantVariables((RegSet *)&local_68,&this->loopTree,local_198);
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
  ::_M_initialize_map(&local_f8,0);
  pBVar5 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,local_198);
  p_Var11 = (pBVar5->insts).
            super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev;
  p_Var10 = p_Var11[1]._M_next;
  local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11[1]._M_prev;
  if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
    }
  }
  p_Var11 = (p_Var10[2]._M_prev)->_M_prev;
  local_1e0 = (p_Var10[3]._M_prev)->_M_prev;
  cVar6 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)cVar4.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                           ._M_cur + 0x10),(key_type *)&local_1e0);
  p_Var10 = p_Var11;
  if (cVar6.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
    p_Var10 = local_1e0;
    local_1e0 = p_Var11;
  }
  cVar6 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)cVar4.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                           ._M_cur + 0x10),(key_type *)&local_1e0);
  if (cVar6.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
    local_1d8 = (size_t *)0x0;
    psStack_1d0 = (size_t *)0x0;
    local_1c8 = 0;
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = operator_new(0x18);
    *(_Any_data **)local_118._M_unused._0_8_ = &local_118;
    *(size_t ***)((long)local_118._M_unused._0_8_ + 8) = &local_1d8;
    *(LoopInvariantCodeMotion **)((long)local_118._M_unused._0_8_ + 0x10) = this;
    local_100 = std::
                _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp:149:44)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp:149:44)>
                ::_M_manager;
    local_178 = &__return_storage_ptr__->_M_h;
    local_150._M_buckets = (__buckets_ptr)p_Var10;
    std::
    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp:149:44)>
    ::_M_invoke(&local_118,(unsigned_long *)&local_150);
    local_170 = psStack_1d0;
    if (local_1d8 != psStack_1d0) {
      psVar9 = local_1d8;
      do {
        pBVar5 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,*psVar9);
        for (p_Var11 = (pBVar5->insts).
                       super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next;
            p_Var11 != (_List_node_base *)&pBVar5->insts; p_Var11 = p_Var11->_M_next) {
          p_Var10 = p_Var11 + 1;
          ir::getDest((ir *)&local_150,(shared_ptr<mocker::ir::IRInst> *)p_Var10);
          if (((_List_node_base *)local_150._M_buckets != (_List_node_base *)0x0) &&
             (cVar7 = std::
                      _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find(&local_68,(key_type *)&local_150),
             cVar7.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>._M_cur !=
             (__node_type *)0x0)) {
            local_190.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                          &p_Var10->_M_next)->_M_ptr;
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_emplace<unsigned_long>(&local_a0,&local_190);
            if (((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)&p_Var10->_M_next)
                ->_M_ptr->type == Call) {
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11[1]._M_prev;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              std::
              deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
              ::emplace_back<std::shared_ptr<mocker::ir::IRInst>const&>
                        ((deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                          *)&local_f8,(shared_ptr<mocker::ir::IRInst> *)p_Var10);
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_bucket_count !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_bucket_count);
          }
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != local_170);
    }
    local_150._M_buckets = &local_150._M_single_bucket;
    local_150._M_bucket_count = 1;
    local_150._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_150._M_element_count = 0;
    local_150._M_rehash_policy._M_max_load_factor = 1.0;
    local_150._M_rehash_policy._M_next_resize = 0;
    local_150._M_single_bucket = (__node_base_ptr)0x0;
    if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
        if (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        std::
        deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
        ::pop_front((deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                     *)&local_f8);
        local_190.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_emplace<unsigned_long>(&local_150,&local_190);
        ir::getOperandsUsed(&local_190,&local_1a8);
        psVar3 = local_190.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (addr = (element_type *)
                    local_190.
                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; addr != (element_type *)psVar3;
            addr = addr + 1) {
          ir::dycLocalReg((ir *)&local_160,(shared_ptr<mocker::ir::Addr> *)addr);
          if (local_160 != 0) {
            cVar8 = std::
                    _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(local_168,(key_type *)&local_160);
            if (cVar8.
                super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)
                  ((long)cVar8.
                         super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                         ._M_cur + 0x20);
            local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      ((long)cVar8.
                             super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                             ._M_cur + 0x28);
            if (local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            if (local_150._M_buckets
                [(ulong)local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr % local_150._M_bucket_count] != (__node_base_ptr)0x0) {
              p_Var1 = local_150._M_buckets
                       [(ulong)local_1b8.
                               super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr % local_150._M_bucket_count]->_M_nxt;
              peVar2 = (element_type *)p_Var1[1]._M_nxt;
              do {
                if (peVar2 == local_1b8.
                              super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr) goto LAB_00111a69;
                p_Var1 = p_Var1->_M_nxt;
              } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                      (peVar2 = (element_type *)p_Var1[1]._M_nxt,
                      (ulong)peVar2 % local_150._M_bucket_count ==
                      (ulong)local_1b8.
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr % local_150._M_bucket_count));
            }
            std::
            deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
            ::emplace_back<std::shared_ptr<mocker::ir::IRInst>&>
                      ((deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                        *)&local_f8,&local_1b8);
LAB_00111a69:
            if (local_1b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b8.
                         super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
          }
        }
        std::
        vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ::~vector(&local_190);
        if (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    intersectSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
              ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&local_a0,
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&local_150);
    __return_storage_ptr__ =
         (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)local_178;
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(local_178,&local_a0);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_150);
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,3);
    }
    if (local_1d8 != (size_t *)0x0) {
      operator_delete(local_1d8,local_1c8 - (long)local_1d8);
    }
  }
  else {
    *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  }
  if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
  }
  std::
  deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
  ::~deque((deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
            *)&local_f8);
  std::
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  return (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)&__return_storage_ptr__->_M_h;
}

Assistant:

std::unordered_set<ir::InstID>
LoopInvariantCodeMotion::findLoopInvariantComputation(
    std::size_t header, const UseDefChain &useDef) {
  const auto &loopNodes = loopTree.getLoops().at(header);

  std::unordered_set<ir::InstID> res;

  auto loopInvVars = loopTree.getLoopInvariantVariables(header);
  std::queue<std::shared_ptr<ir::IRInst>> worklist;

  // we only hoist Calls that can not be avoided
  auto &headerBB = func.getBasicBlock(header);
  auto br = ir::dyc<ir::Branch>(headerBB.getInsts().back());
  auto thenLabel = br->getThen()->getID(), elseLabel = br->getElse()->getID();

  if (isIn(loopNodes, elseLabel))
    std::swap(thenLabel, elseLabel);

  if (isIn(loopNodes, elseLabel))
    return {};

  std::vector<std::size_t> mustPass;
  std::function<void(std::size_t)> visit = [&visit, &mustPass,
                                            this](std::size_t cur) {
    mustPass.emplace_back(cur);
    auto succs = func.getBasicBlock(cur).getSuccessors();
    if (succs.size() != 1)
      return;
    visit(succs.at(0));
  };
  visit(thenLabel);

  for (auto &node : mustPass) {
    const auto &bb = func.getBasicBlock(node);
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest || !isIn(loopInvVars, dest))
        continue;
      res.emplace(inst->getID());
      if (auto call = ir::dyc<ir::Call>(inst)) {
        worklist.emplace(inst);
      }
    }
  }

  std::unordered_set<ir::InstID> related;
  while (!worklist.empty()) {
    auto inst = worklist.front();
    worklist.pop();
    related.emplace(inst->getID());
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      if (auto reg = ir::dycLocalReg(operand)) {
        auto def = useDef.getDef(reg).getInst();
        if (!isIn(related, def->getID()))
          worklist.emplace(def);
      }
    }
  }

  intersectSet(res, related);
  return res;
}